

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::Socket> * __thiscall asl::Array<asl::Socket>::reserve(Array<asl::Socket> *this,int m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  undefined8 *puVar6;
  int __fd;
  Socket *__src;
  int iVar7;
  Socket *__dest;
  size_t __size;
  
  __src = this->_a;
  iVar1 = *(int *)((long)&__src[-2].super_SmartObject._p + 4);
  if (iVar1 < m) {
    iVar7 = iVar1 * 2;
    if (iVar1 * 2 <= m) {
      iVar7 = m;
    }
    iVar2 = *(int *)&__src[-2].super_SmartObject._p;
    if (((long)iVar1 & 0x1fffffffffffff00U) == 0) {
      pvVar5 = malloc((long)iVar7 * 8 + 0x10);
      if (pvVar5 == (void *)0x0) goto LAB_0011f08a;
      __dest = (Socket *)((long)pvVar5 + 0x10);
      if (iVar2 <= m) {
        m = iVar2;
      }
      memcpy(__dest,__src,(long)(m << 3));
      __fd = (int)__src;
    }
    else {
      dup(this,m);
      iVar3 = *(int *)&this->_a[-1].super_SmartObject._p;
      __size = (long)iVar7 * 8 + 0x10;
      piVar4 = (int *)realloc(this->_a + -2,__size);
      __fd = (int)__size;
      if (piVar4 == (int *)0x0) {
LAB_0011f08a:
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = dup2;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      __dest = (Socket *)(piVar4 + 4);
      this->_a = __dest;
      piVar4[2] = iVar3;
      piVar4[1] = iVar7;
      *piVar4 = iVar2;
      iVar7 = iVar1;
    }
    if (iVar7 != iVar1) {
      dup(this,__fd);
      iVar1 = *(int *)&this->_a[-1].super_SmartObject._p;
      ::free(this->_a + -2);
      this->_a = __dest;
      *(int *)&__dest[-1].super_SmartObject._p = iVar1;
      *(int *)((long)&__dest[-2].super_SmartObject._p + 4) = iVar7;
      *(int *)&__dest[-2].super_SmartObject._p = iVar2;
    }
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}